

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void __thiscall clickhouse::Type::~Type(Type *this)

{
  EnumImpl *this_00;
  ulong uStack_10;
  
  switch(this->code_) {
  case DateTime:
  case DateTime64:
    this_00 = (EnumImpl *)(this->field_1).array_;
    if (this_00 != (EnumImpl *)0x0) {
      std::__cxx11::string::~string
                ((string *)&(this_00->value_to_name)._M_t._M_impl.super__Rb_tree_header);
    }
    uStack_10 = 0x28;
    break;
  default:
    return;
  case Array:
  case Nullable:
    this_00 = (EnumImpl *)(this->field_1).array_;
    if (this_00 != (EnumImpl *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this_00->value_to_name)._M_t._M_impl.super__Rb_tree_header);
    }
    uStack_10 = 0x10;
    break;
  case Tuple:
    this_00 = (EnumImpl *)(this->field_1).array_;
    if (this_00 != (EnumImpl *)0x0) {
      std::
      vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
      ::~vector((vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
                 *)this_00);
    }
    uStack_10 = 0x18;
    break;
  case Enum8:
  case Enum16:
    this_00 = (this->field_1).enum_;
    if (this_00 != (EnumImpl *)0x0) {
      EnumImpl::~EnumImpl(this_00);
    }
    uStack_10 = 0x60;
    break;
  case Decimal:
  case Decimal32:
  case Decimal64:
  case Decimal128:
    this_00 = (EnumImpl *)(this->field_1).array_;
    uStack_10 = 0x10;
  }
  operator_delete(this_00,uStack_10);
  return;
}

Assistant:

Type::~Type() {
    if (code_ == Array) {
        delete array_;
    } else if (code_ == DateTime || code_ == DateTime64) {
        delete date_time_;
    } else if (code_ == Tuple) {
        delete tuple_;
    } else if (code_ == Nullable) {
        delete nullable_;
    } else if (code_ == Enum8 || code_ == Enum16) {
        delete enum_;
    } else if (code_== Decimal || code_== Decimal32 || code_ == Decimal64 || code_ == Decimal128) {
        delete decimal_;
    }
}